

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O0

bool __thiscall
ON_Brep::RemoveNesting(ON_Brep *this,bool bExtractSingleSegments,bool bEdges,bool bTrimCurves)

{
  bool bVar1;
  int iVar2;
  ON_Curve **ppOVar3;
  ON_PolyCurve *pOVar4;
  ON_PolyCurve *polycurve;
  int local_18;
  int count;
  int i;
  bool rc;
  bool bTrimCurves_local;
  bool bEdges_local;
  bool bExtractSingleSegments_local;
  ON_Brep *this_local;
  
  count._0_1_ = false;
  if (bEdges) {
    iVar2 = ON_SimpleArray<ON_Curve_*>::Count(&(this->m_C3).super_ON_SimpleArray<ON_Curve_*>);
    for (local_18 = 0; local_18 < iVar2; local_18 = local_18 + 1) {
      ppOVar3 = ON_SimpleArray<ON_Curve_*>::operator[]
                          (&(this->m_C3).super_ON_SimpleArray<ON_Curve_*>,local_18);
      pOVar4 = ON_PolyCurve::Cast((ON_Object *)*ppOVar3);
      if (pOVar4 != (ON_PolyCurve *)0x0) {
        bVar1 = ON_PolyCurve::RemoveNesting(pOVar4);
        if (bVar1) {
          count._0_1_ = true;
        }
        if (bExtractSingleSegments) {
          ON_PolyCurve::Count(pOVar4);
        }
      }
    }
  }
  if (bTrimCurves) {
    iVar2 = ON_SimpleArray<ON_Curve_*>::Count(&(this->m_C2).super_ON_SimpleArray<ON_Curve_*>);
    for (local_18 = 0; local_18 < iVar2; local_18 = local_18 + 1) {
      ppOVar3 = ON_SimpleArray<ON_Curve_*>::operator[]
                          (&(this->m_C2).super_ON_SimpleArray<ON_Curve_*>,local_18);
      pOVar4 = ON_PolyCurve::Cast((ON_Object *)*ppOVar3);
      if (pOVar4 != (ON_PolyCurve *)0x0) {
        bVar1 = ON_PolyCurve::RemoveNesting(pOVar4);
        if (bVar1) {
          count._0_1_ = true;
        }
        if (bExtractSingleSegments) {
          ON_PolyCurve::Count(pOVar4);
        }
      }
    }
  }
  return count._0_1_;
}

Assistant:

bool ON_Brep::RemoveNesting(
        bool bExtractSingleSegments,
        bool bEdges, 
        bool bTrimCurves
        )
{
  bool rc = false;
  // TODO
  int i, count;
  ON_PolyCurve* polycurve;

  if ( bEdges )
  {
    count = m_C3.Count();
    for ( i = 0; i < count; i++ )
    {
      polycurve = ON_PolyCurve::Cast(m_C3[i]);
      if ( 0 != polycurve )
      {
        if ( polycurve->RemoveNesting() )
          rc = true;
        if ( bExtractSingleSegments && 1 == polycurve->Count() )
        {
          // TODO - extract segment and update edge's proxy information
        }
      }
    }
  }

  if ( bTrimCurves )
  {
    count = m_C2.Count();
    for ( i = 0; i < count; i++ )
    {
      polycurve = ON_PolyCurve::Cast(m_C2[i]);
      if ( 0 != polycurve )
      {
        if ( polycurve->RemoveNesting() )
          rc = true;
        if ( bExtractSingleSegments && 1 == polycurve->Count() )
        {
          // TODO - extract segment and update trims's proxy information
        }
      }
    }
  }

  return rc;
}